

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O0

size_t poly1305_combine(poly1305_state_internal *st,uint8_t *m,size_t bytes)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  poly1305_power *ppVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t local_16b8;
  size_t consumed;
  uint64_t c;
  uint64_t t4;
  uint64_t t3;
  uint64_t t2;
  uint64_t t1;
  uint64_t t0;
  uint64_t r2;
  uint64_t r1;
  uint64_t r0;
  xmmi C2;
  xmmi C1;
  xmmi T6;
  xmmi T5;
  xmmi T4;
  xmmi T3;
  xmmi T2;
  xmmi T1;
  xmmi T0;
  xmmi M4;
  xmmi M3;
  xmmi M2;
  xmmi M1;
  xmmi M0;
  xmmi H4;
  xmmi H3;
  xmmi H2;
  xmmi H1;
  xmmi H0;
  poly1305_power *p;
  xmmi FIVE;
  xmmi HIBIT;
  xmmi MMASK;
  size_t bytes_local;
  uint8_t *m_local;
  poly1305_state_internal *st_local;
  int local_a8;
  int local_88;
  int local_68;
  int local_48;
  uint local_28;
  
  local_16b8 = 0;
  H1[1] = (st->field_1).HH[0];
  H0[0] = (st->field_1).HH[1];
  H2[1] = (st->field_1).HH[2];
  H1[0] = (st->field_1).HH[3];
  H3[1] = (st->field_1).HH[4];
  H2[0] = (st->field_1).HH[5];
  H4[1] = (st->field_1).HH[6];
  H3[0] = (st->field_1).HH[7];
  M0[1] = (st->field_1).HH[8];
  H4[0] = (st->field_1).HH[9];
  ppVar7 = st->P + 1;
  if (0x1f < bytes) {
    uVar13 = *(ulong *)m;
    uVar14 = *(ulong *)(m + 0x10);
    uVar19 = *(ulong *)(m + 0x18);
    uVar8 = *(ulong *)(m + 8) << 0xc;
    uVar9 = (H1[1] & 0xffffffffU) * ((ppVar7->R20).u[0] & 0xffffffff) +
            (H2[1] & 0xffffffffU) * (st->P[1].S24.u[0] & 0xffffffff) +
            (H3[1] & 0xffffffffU) * (st->P[1].S23.u[0] & 0xffffffff) +
            (H4[1] & 0xffffffffU) * (st->P[1].S22.u[0] & 0xffffffff) +
            (M0[1] & 0xffffffffU) * (st->P[1].S21.u[0] & 0xffffffff) + (uVar13 & 0x3ffffff);
    uVar15 = (H0[0] & 0xffffffffU) * (st->P[1].R20.u[1] & 0xffffffff) +
             (H1[0] & 0xffffffffU) * (st->P[1].S24.u[1] & 0xffffffff) +
             (H2[0] & 0xffffffffU) * (st->P[1].S23.u[1] & 0xffffffff) +
             (H3[0] & 0xffffffffU) * (st->P[1].S22.u[1] & 0xffffffff) +
             (H4[0] & 0xffffffffU) * (st->P[1].S21.u[1] & 0xffffffff) + (uVar14 & 0x3ffffff);
    uVar10 = (H1[1] & 0xffffffffU) * (st->P[1].R23.u[0] & 0xffffffff) +
             (H2[1] & 0xffffffffU) * (st->P[1].R22.u[0] & 0xffffffff) +
             (H3[1] & 0xffffffffU) * (st->P[1].R21.u[0] & 0xffffffff) +
             (H4[1] & 0xffffffffU) * ((ppVar7->R20).u[0] & 0xffffffff) +
             (M0[1] & 0xffffffffU) * (st->P[1].S24.u[0] & 0xffffffff) + (uVar8 >> 0x1a & 0x3ffffff);
    uVar16 = (H0[0] & 0xffffffffU) * (st->P[1].R23.u[1] & 0xffffffff) +
             (H1[0] & 0xffffffffU) * (st->P[1].R22.u[1] & 0xffffffff) +
             (H2[0] & 0xffffffffU) * (st->P[1].R21.u[1] & 0xffffffff) +
             (H3[0] & 0xffffffffU) * (st->P[1].R20.u[1] & 0xffffffff) +
             (H4[0] & 0xffffffffU) * (st->P[1].S24.u[1] & 0xffffffff) + (uVar19 >> 0x1a & 0x3ffffff)
    ;
    uVar11 = (H1[1] & 0xffffffffU) * (st->P[1].R21.u[0] & 0xffffffff) +
             (H2[1] & 0xffffffffU) * ((ppVar7->R20).u[0] & 0xffffffff) +
             (H3[1] & 0xffffffffU) * (st->P[1].S24.u[0] & 0xffffffff) +
             (H4[1] & 0xffffffffU) * (st->P[1].S23.u[0] & 0xffffffff) +
             (M0[1] & 0xffffffffU) * (st->P[1].S22.u[0] & 0xffffffff) + (uVar13 >> 0x1a & 0x3ffffff)
             + (uVar9 >> 0x1a);
    uVar17 = (H0[0] & 0xffffffffU) * (st->P[1].R21.u[1] & 0xffffffff) +
             (H1[0] & 0xffffffffU) * (st->P[1].R20.u[1] & 0xffffffff) +
             (H2[0] & 0xffffffffU) * (st->P[1].S24.u[1] & 0xffffffff) +
             (H3[0] & 0xffffffffU) * (st->P[1].S23.u[1] & 0xffffffff) +
             (H4[0] & 0xffffffffU) * (st->P[1].S22.u[1] & 0xffffffff) + (uVar14 >> 0x1a & 0x3ffffff)
             + (uVar15 >> 0x1a);
    uVar12 = (H1[1] & 0xffffffffU) * (st->P[1].R24.u[0] & 0xffffffff) +
             (H2[1] & 0xffffffffU) * (st->P[1].R23.u[0] & 0xffffffff) +
             (H3[1] & 0xffffffffU) * (st->P[1].R22.u[0] & 0xffffffff) +
             (H4[1] & 0xffffffffU) * (st->P[1].R21.u[0] & 0xffffffff) +
             (M0[1] & 0xffffffffU) * ((ppVar7->R20).u[0] & 0xffffffff) +
             (*(ulong *)(m + 8) >> 0x28 | 0x1000000) + (uVar10 >> 0x1a);
    uVar18 = (H0[0] & 0xffffffffU) * (st->P[1].R24.u[1] & 0xffffffff) +
             (H1[0] & 0xffffffffU) * (st->P[1].R23.u[1] & 0xffffffff) +
             (H2[0] & 0xffffffffU) * (st->P[1].R22.u[1] & 0xffffffff) +
             (H3[0] & 0xffffffffU) * (st->P[1].R21.u[1] & 0xffffffff) +
             (H4[0] & 0xffffffffU) * (st->P[1].R20.u[1] & 0xffffffff) + (uVar19 >> 0x28 | 0x1000000)
             + (uVar16 >> 0x1a);
    uVar13 = (H1[1] & 0xffffffffU) * (st->P[1].R22.u[0] & 0xffffffff) +
             (H2[1] & 0xffffffffU) * (st->P[1].R21.u[0] & 0xffffffff) +
             (H3[1] & 0xffffffffU) * ((ppVar7->R20).u[0] & 0xffffffff) +
             (H4[1] & 0xffffffffU) * (st->P[1].S24.u[0] & 0xffffffff) +
             (M0[1] & 0xffffffffU) * (st->P[1].S23.u[0] & 0xffffffff) +
             (uVar13 >> 0x34 | uVar8 & 0x3ffffff) + (uVar11 >> 0x1a);
    uVar19 = (H0[0] & 0xffffffffU) * (st->P[1].R22.u[1] & 0xffffffff) +
             (H1[0] & 0xffffffffU) * (st->P[1].R21.u[1] & 0xffffffff) +
             (H2[0] & 0xffffffffU) * (st->P[1].R20.u[1] & 0xffffffff) +
             (H3[0] & 0xffffffffU) * (st->P[1].S24.u[1] & 0xffffffff) +
             (H4[0] & 0xffffffffU) * (st->P[1].S23.u[1] & 0xffffffff) +
             (uVar14 >> 0x34 | uVar19 & 0x3ffffff) + (uVar17 >> 0x1a);
    uVar14 = (uVar9 & 0x3ffffff) + (uVar12 >> 0x1a & 0xffffffff) * 5;
    uVar8 = (uVar15 & 0x3ffffff) + (uVar18 >> 0x1a & 0xffffffff) * 5;
    H3[1] = uVar13 & 0x3ffffff;
    H2[0] = uVar19 & 0x3ffffff;
    H1[1] = uVar14 & 0x3ffffff;
    H0[0] = uVar8 & 0x3ffffff;
    uVar13 = (uVar10 & 0x3ffffff) + (uVar13 >> 0x1a);
    uVar19 = (uVar16 & 0x3ffffff) + (uVar19 >> 0x1a);
    H2[1] = (uVar11 & 0x3ffffff) + (uVar14 >> 0x1a);
    H1[0] = (uVar17 & 0x3ffffff) + (uVar8 >> 0x1a);
    H4[1] = uVar13 & 0x3ffffff;
    H3[0] = uVar19 & 0x3ffffff;
    M0[1] = (uVar12 & 0x3ffffff) + (uVar13 >> 0x1a);
    H4[0] = (uVar18 & 0x3ffffff) + (uVar19 >> 0x1a);
    local_16b8 = 0x20;
  }
  uVar6 = st->P[1].R20.d[1];
  uVar1 = st->P[1].R20.d[3];
  uVar2 = st->P[1].R21.d[1];
  uVar3 = st->P[1].R21.d[3];
  uVar4 = st->P[1].R22.d[1];
  uVar5 = st->P[1].R22.d[3];
  st->P[1].R20.d[2] = uVar6 & 0x3ffffff;
  st->P[1].R21.d[2] = ((uint)(CONCAT44(uVar1,uVar6) >> 0x1a) | uVar2 << 0x12) & 0x3ffffff;
  r2._1_4_ = (uint)(CONCAT44(uVar3,uVar2) >> 8);
  st->P[1].R22.d[2] = r2._1_4_ & 0x3ffffff;
  st->P[1].R23.d[2] = (uVar3 >> 2 | uVar4 << 10) & 0x3ffffff;
  t0._2_4_ = (uint32_t)(CONCAT44(uVar5,uVar4) >> 0x10);
  st->P[1].R24.d[2] = t0._2_4_;
  st->P[1].S21.d[2] = st->P[1].R21.d[2] * 5;
  st->P[1].S22.d[2] = st->P[1].R22.d[2] * 5;
  st->P[1].S23.d[2] = st->P[1].R23.d[2] * 5;
  st->P[1].S24.d[2] = st->P[1].R24.d[2] * 5;
  uVar13 = (H1[1] & 0xffffffffU) * ((ppVar7->R20).u[0] & 0xffffffff) +
           (H2[1] & 0xffffffffU) * (st->P[1].S24.u[0] & 0xffffffff) +
           (H3[1] & 0xffffffffU) * (st->P[1].S23.u[0] & 0xffffffff) +
           (H4[1] & 0xffffffffU) * (st->P[1].S22.u[0] & 0xffffffff) +
           (M0[1] & 0xffffffffU) * (st->P[1].S21.u[0] & 0xffffffff);
  uVar10 = (H0[0] & 0xffffffffU) * (st->P[1].R20.u[1] & 0xffffffff) +
           (H1[0] & 0xffffffffU) * (st->P[1].S24.u[1] & 0xffffffff) +
           (H2[0] & 0xffffffffU) * (st->P[1].S23.u[1] & 0xffffffff) +
           (H3[0] & 0xffffffffU) * (st->P[1].S22.u[1] & 0xffffffff) +
           (H4[0] & 0xffffffffU) * (st->P[1].S21.u[1] & 0xffffffff);
  uVar14 = (H1[1] & 0xffffffffU) * (st->P[1].R23.u[0] & 0xffffffff) +
           (H2[1] & 0xffffffffU) * (st->P[1].R22.u[0] & 0xffffffff) +
           (H3[1] & 0xffffffffU) * (st->P[1].R21.u[0] & 0xffffffff) +
           (H4[1] & 0xffffffffU) * ((ppVar7->R20).u[0] & 0xffffffff) +
           (M0[1] & 0xffffffffU) * (st->P[1].S24.u[0] & 0xffffffff);
  uVar11 = (H0[0] & 0xffffffffU) * (st->P[1].R23.u[1] & 0xffffffff) +
           (H1[0] & 0xffffffffU) * (st->P[1].R22.u[1] & 0xffffffff) +
           (H2[0] & 0xffffffffU) * (st->P[1].R21.u[1] & 0xffffffff) +
           (H3[0] & 0xffffffffU) * (st->P[1].R20.u[1] & 0xffffffff) +
           (H4[0] & 0xffffffffU) * (st->P[1].S24.u[1] & 0xffffffff);
  uVar19 = (H1[1] & 0xffffffffU) * (st->P[1].R21.u[0] & 0xffffffff) +
           (H2[1] & 0xffffffffU) * ((ppVar7->R20).u[0] & 0xffffffff) +
           (H3[1] & 0xffffffffU) * (st->P[1].S24.u[0] & 0xffffffff) +
           (H4[1] & 0xffffffffU) * (st->P[1].S23.u[0] & 0xffffffff) +
           (M0[1] & 0xffffffffU) * (st->P[1].S22.u[0] & 0xffffffff) + (uVar13 >> 0x1a);
  uVar12 = (H0[0] & 0xffffffffU) * (st->P[1].R21.u[1] & 0xffffffff) +
           (H1[0] & 0xffffffffU) * (st->P[1].R20.u[1] & 0xffffffff) +
           (H2[0] & 0xffffffffU) * (st->P[1].S24.u[1] & 0xffffffff) +
           (H3[0] & 0xffffffffU) * (st->P[1].S23.u[1] & 0xffffffff) +
           (H4[0] & 0xffffffffU) * (st->P[1].S22.u[1] & 0xffffffff) + (uVar10 >> 0x1a);
  uVar8 = (H1[1] & 0xffffffffU) * (st->P[1].R24.u[0] & 0xffffffff) +
          (H2[1] & 0xffffffffU) * (st->P[1].R23.u[0] & 0xffffffff) +
          (H3[1] & 0xffffffffU) * (st->P[1].R22.u[0] & 0xffffffff) +
          (H4[1] & 0xffffffffU) * (st->P[1].R21.u[0] & 0xffffffff) +
          (M0[1] & 0xffffffffU) * ((ppVar7->R20).u[0] & 0xffffffff) + (uVar14 >> 0x1a);
  uVar15 = (H0[0] & 0xffffffffU) * (st->P[1].R24.u[1] & 0xffffffff) +
           (H1[0] & 0xffffffffU) * (st->P[1].R23.u[1] & 0xffffffff) +
           (H2[0] & 0xffffffffU) * (st->P[1].R22.u[1] & 0xffffffff) +
           (H3[0] & 0xffffffffU) * (st->P[1].R21.u[1] & 0xffffffff) +
           (H4[0] & 0xffffffffU) * (st->P[1].R20.u[1] & 0xffffffff) + (uVar11 >> 0x1a);
  uVar9 = (H1[1] & 0xffffffffU) * (st->P[1].R22.u[0] & 0xffffffff) +
          (H2[1] & 0xffffffffU) * (st->P[1].R21.u[0] & 0xffffffff) +
          (H3[1] & 0xffffffffU) * ((ppVar7->R20).u[0] & 0xffffffff) +
          (H4[1] & 0xffffffffU) * (st->P[1].S24.u[0] & 0xffffffff) +
          (M0[1] & 0xffffffffU) * (st->P[1].S23.u[0] & 0xffffffff) + (uVar19 >> 0x1a);
  uVar16 = (H0[0] & 0xffffffffU) * (st->P[1].R22.u[1] & 0xffffffff) +
           (H1[0] & 0xffffffffU) * (st->P[1].R21.u[1] & 0xffffffff) +
           (H2[0] & 0xffffffffU) * (st->P[1].R20.u[1] & 0xffffffff) +
           (H3[0] & 0xffffffffU) * (st->P[1].S24.u[1] & 0xffffffff) +
           (H4[0] & 0xffffffffU) * (st->P[1].S23.u[1] & 0xffffffff) + (uVar12 >> 0x1a);
  uVar13 = (uVar13 & 0x3ffffff) + (uVar8 >> 0x1a & 0xffffffff) * 5;
  uVar10 = (uVar10 & 0x3ffffff) + (uVar15 >> 0x1a & 0xffffffff) * 5;
  uVar14 = (uVar14 & 0x3ffffff) + (uVar9 >> 0x1a);
  uVar11 = (uVar11 & 0x3ffffff) + (uVar16 >> 0x1a);
  local_28 = ((uint)uVar13 & 0x3ffffff) + ((uint)uVar10 & 0x3ffffff);
  local_48 = ((uint)uVar19 & 0x3ffffff) + (int)(uVar13 >> 0x1a) +
             ((uint)uVar12 & 0x3ffffff) + (int)(uVar10 >> 0x1a);
  local_68 = ((uint)uVar9 & 0x3ffffff) + ((uint)uVar16 & 0x3ffffff);
  local_88 = ((uint)uVar14 & 0x3ffffff) + ((uint)uVar11 & 0x3ffffff);
  local_a8 = ((uint)uVar8 & 0x3ffffff) + (int)(uVar14 >> 0x1a) +
             ((uint)uVar15 & 0x3ffffff) + (int)(uVar11 >> 0x1a);
  uVar13 = (long)local_48 + ((ulong)(long)(int)local_28 >> 0x1a);
  uVar14 = (long)local_68 + (uVar13 >> 0x1a);
  uVar19 = (long)local_88 + (uVar14 >> 0x1a);
  uVar6 = (uint)uVar19 & 0x3ffffff;
  uVar19 = (long)local_a8 + (uVar19 >> 0x1a);
  uVar8 = (ulong)(local_28 & 0x3ffffff) + (uVar19 >> 0x1a) * 5;
  uVar13 = (ulong)((uint)uVar13 & 0x3ffffff) + (uVar8 >> 0x1a);
  (st->field_1).HH[0] = uVar8 & 0x3ffffff | uVar13 * 0x4000000 & 0xfffffffffff;
  (st->field_1).HH[1] =
       uVar13 >> 0x12 | (ulong)((uint)uVar14 & 0x3ffffff) << 8 | ((ulong)uVar6 & 0x3ff) << 0x22;
  (st->field_1).HH[2] = (ulong)(uVar6 >> 10) | (uVar19 & 0x3ffffff) << 0x10;
  return local_16b8;
}

Assistant:

static size_t poly1305_combine(poly1305_state_internal *st, const uint8_t *m,
                               size_t bytes) {
  const xmmi MMASK =
      _mm_load_si128((const xmmi *)poly1305_x64_sse2_message_mask);
  const xmmi HIBIT = _mm_load_si128((const xmmi *)poly1305_x64_sse2_1shl128);
  const xmmi FIVE = _mm_load_si128((const xmmi *)poly1305_x64_sse2_5);

  poly1305_power *p;
  xmmi H0, H1, H2, H3, H4;
  xmmi M0, M1, M2, M3, M4;
  xmmi T0, T1, T2, T3, T4, T5, T6;
  xmmi C1, C2;

  uint64_t r0, r1, r2;
  uint64_t t0, t1, t2, t3, t4;
  uint64_t c;
  size_t consumed = 0;

  H0 = st->H[0];
  H1 = st->H[1];
  H2 = st->H[2];
  H3 = st->H[3];
  H4 = st->H[4];

  // p = [r^2,r^2]
  p = &st->P[1];

  if (bytes >= 32) {
    // H *= [r^2,r^2]
    T0 = _mm_mul_epu32(H0, p->R20.v);
    T1 = _mm_mul_epu32(H0, p->R21.v);
    T2 = _mm_mul_epu32(H0, p->R22.v);
    T3 = _mm_mul_epu32(H0, p->R23.v);
    T4 = _mm_mul_epu32(H0, p->R24.v);
    T5 = _mm_mul_epu32(H1, p->S24.v);
    T6 = _mm_mul_epu32(H1, p->R20.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H2, p->S23.v);
    T6 = _mm_mul_epu32(H2, p->S24.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H3, p->S22.v);
    T6 = _mm_mul_epu32(H3, p->S23.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H4, p->S21.v);
    T6 = _mm_mul_epu32(H4, p->S22.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H1, p->R21.v);
    T6 = _mm_mul_epu32(H1, p->R22.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H2, p->R20.v);
    T6 = _mm_mul_epu32(H2, p->R21.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H3, p->S24.v);
    T6 = _mm_mul_epu32(H3, p->R20.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H4, p->S23.v);
    T6 = _mm_mul_epu32(H4, p->S24.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H1, p->R23.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(H2, p->R22.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(H3, p->R21.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(H4, p->R20.v);
    T4 = _mm_add_epi64(T4, T5);

    // H += [Mx,My]
    T5 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 0)),
                            _mm_loadl_epi64((const xmmi *)(m + 16)));
    T6 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 8)),
                            _mm_loadl_epi64((const xmmi *)(m + 24)));
    M0 = _mm_and_si128(MMASK, T5);
    M1 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    T5 = _mm_or_si128(_mm_srli_epi64(T5, 52), _mm_slli_epi64(T6, 12));
    M2 = _mm_and_si128(MMASK, T5);
    M3 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    M4 = _mm_or_si128(_mm_srli_epi64(T6, 40), HIBIT);

    T0 = _mm_add_epi64(T0, M0);
    T1 = _mm_add_epi64(T1, M1);
    T2 = _mm_add_epi64(T2, M2);
    T3 = _mm_add_epi64(T3, M3);
    T4 = _mm_add_epi64(T4, M4);

    // reduce
    C1 = _mm_srli_epi64(T0, 26);
    C2 = _mm_srli_epi64(T3, 26);
    T0 = _mm_and_si128(T0, MMASK);
    T3 = _mm_and_si128(T3, MMASK);
    T1 = _mm_add_epi64(T1, C1);
    T4 = _mm_add_epi64(T4, C2);
    C1 = _mm_srli_epi64(T1, 26);
    C2 = _mm_srli_epi64(T4, 26);
    T1 = _mm_and_si128(T1, MMASK);
    T4 = _mm_and_si128(T4, MMASK);
    T2 = _mm_add_epi64(T2, C1);
    T0 = _mm_add_epi64(T0, _mm_mul_epu32(C2, FIVE));
    C1 = _mm_srli_epi64(T2, 26);
    C2 = _mm_srli_epi64(T0, 26);
    T2 = _mm_and_si128(T2, MMASK);
    T0 = _mm_and_si128(T0, MMASK);
    T3 = _mm_add_epi64(T3, C1);
    T1 = _mm_add_epi64(T1, C2);
    C1 = _mm_srli_epi64(T3, 26);
    T3 = _mm_and_si128(T3, MMASK);
    T4 = _mm_add_epi64(T4, C1);

    // H = (H*[r^2,r^2] + [Mx,My])
    H0 = T0;
    H1 = T1;
    H2 = T2;
    H3 = T3;
    H4 = T4;

    consumed = 32;
  }

  // finalize, H *= [r^2,r]
  r0 = ((uint64_t)p->R20.d[3] << 32) | (uint64_t)p->R20.d[1];
  r1 = ((uint64_t)p->R21.d[3] << 32) | (uint64_t)p->R21.d[1];
  r2 = ((uint64_t)p->R22.d[3] << 32) | (uint64_t)p->R22.d[1];

  p->R20.d[2] = (uint32_t)(r0) & 0x3ffffff;
  p->R21.d[2] = (uint32_t)((r0 >> 26) | (r1 << 18)) & 0x3ffffff;
  p->R22.d[2] = (uint32_t)((r1 >> 8)) & 0x3ffffff;
  p->R23.d[2] = (uint32_t)((r1 >> 34) | (r2 << 10)) & 0x3ffffff;
  p->R24.d[2] = (uint32_t)((r2 >> 16));
  p->S21.d[2] = p->R21.d[2] * 5;
  p->S22.d[2] = p->R22.d[2] * 5;
  p->S23.d[2] = p->R23.d[2] * 5;
  p->S24.d[2] = p->R24.d[2] * 5;

  // H *= [r^2,r]
  T0 = _mm_mul_epu32(H0, p->R20.v);
  T1 = _mm_mul_epu32(H0, p->R21.v);
  T2 = _mm_mul_epu32(H0, p->R22.v);
  T3 = _mm_mul_epu32(H0, p->R23.v);
  T4 = _mm_mul_epu32(H0, p->R24.v);
  T5 = _mm_mul_epu32(H1, p->S24.v);
  T6 = _mm_mul_epu32(H1, p->R20.v);
  T0 = _mm_add_epi64(T0, T5);
  T1 = _mm_add_epi64(T1, T6);
  T5 = _mm_mul_epu32(H2, p->S23.v);
  T6 = _mm_mul_epu32(H2, p->S24.v);
  T0 = _mm_add_epi64(T0, T5);
  T1 = _mm_add_epi64(T1, T6);
  T5 = _mm_mul_epu32(H3, p->S22.v);
  T6 = _mm_mul_epu32(H3, p->S23.v);
  T0 = _mm_add_epi64(T0, T5);
  T1 = _mm_add_epi64(T1, T6);
  T5 = _mm_mul_epu32(H4, p->S21.v);
  T6 = _mm_mul_epu32(H4, p->S22.v);
  T0 = _mm_add_epi64(T0, T5);
  T1 = _mm_add_epi64(T1, T6);
  T5 = _mm_mul_epu32(H1, p->R21.v);
  T6 = _mm_mul_epu32(H1, p->R22.v);
  T2 = _mm_add_epi64(T2, T5);
  T3 = _mm_add_epi64(T3, T6);
  T5 = _mm_mul_epu32(H2, p->R20.v);
  T6 = _mm_mul_epu32(H2, p->R21.v);
  T2 = _mm_add_epi64(T2, T5);
  T3 = _mm_add_epi64(T3, T6);
  T5 = _mm_mul_epu32(H3, p->S24.v);
  T6 = _mm_mul_epu32(H3, p->R20.v);
  T2 = _mm_add_epi64(T2, T5);
  T3 = _mm_add_epi64(T3, T6);
  T5 = _mm_mul_epu32(H4, p->S23.v);
  T6 = _mm_mul_epu32(H4, p->S24.v);
  T2 = _mm_add_epi64(T2, T5);
  T3 = _mm_add_epi64(T3, T6);
  T5 = _mm_mul_epu32(H1, p->R23.v);
  T4 = _mm_add_epi64(T4, T5);
  T5 = _mm_mul_epu32(H2, p->R22.v);
  T4 = _mm_add_epi64(T4, T5);
  T5 = _mm_mul_epu32(H3, p->R21.v);
  T4 = _mm_add_epi64(T4, T5);
  T5 = _mm_mul_epu32(H4, p->R20.v);
  T4 = _mm_add_epi64(T4, T5);

  C1 = _mm_srli_epi64(T0, 26);
  C2 = _mm_srli_epi64(T3, 26);
  T0 = _mm_and_si128(T0, MMASK);
  T3 = _mm_and_si128(T3, MMASK);
  T1 = _mm_add_epi64(T1, C1);
  T4 = _mm_add_epi64(T4, C2);
  C1 = _mm_srli_epi64(T1, 26);
  C2 = _mm_srli_epi64(T4, 26);
  T1 = _mm_and_si128(T1, MMASK);
  T4 = _mm_and_si128(T4, MMASK);
  T2 = _mm_add_epi64(T2, C1);
  T0 = _mm_add_epi64(T0, _mm_mul_epu32(C2, FIVE));
  C1 = _mm_srli_epi64(T2, 26);
  C2 = _mm_srli_epi64(T0, 26);
  T2 = _mm_and_si128(T2, MMASK);
  T0 = _mm_and_si128(T0, MMASK);
  T3 = _mm_add_epi64(T3, C1);
  T1 = _mm_add_epi64(T1, C2);
  C1 = _mm_srli_epi64(T3, 26);
  T3 = _mm_and_si128(T3, MMASK);
  T4 = _mm_add_epi64(T4, C1);

  // H = H[0]+H[1]
  H0 = _mm_add_epi64(T0, _mm_srli_si128(T0, 8));
  H1 = _mm_add_epi64(T1, _mm_srli_si128(T1, 8));
  H2 = _mm_add_epi64(T2, _mm_srli_si128(T2, 8));
  H3 = _mm_add_epi64(T3, _mm_srli_si128(T3, 8));
  H4 = _mm_add_epi64(T4, _mm_srli_si128(T4, 8));

  t0 = _mm_cvtsi128_si32(H0);
  c = (t0 >> 26);
  t0 &= 0x3ffffff;
  t1 = _mm_cvtsi128_si32(H1) + c;
  c = (t1 >> 26);
  t1 &= 0x3ffffff;
  t2 = _mm_cvtsi128_si32(H2) + c;
  c = (t2 >> 26);
  t2 &= 0x3ffffff;
  t3 = _mm_cvtsi128_si32(H3) + c;
  c = (t3 >> 26);
  t3 &= 0x3ffffff;
  t4 = _mm_cvtsi128_si32(H4) + c;
  c = (t4 >> 26);
  t4 &= 0x3ffffff;
  t0 = t0 + (c * 5);
  c = (t0 >> 26);
  t0 &= 0x3ffffff;
  t1 = t1 + c;

  st->HH[0] = ((t0) | (t1 << 26)) & UINT64_C(0xfffffffffff);
  st->HH[1] = ((t1 >> 18) | (t2 << 8) | (t3 << 34)) & UINT64_C(0xfffffffffff);
  st->HH[2] = ((t3 >> 10) | (t4 << 16)) & UINT64_C(0x3ffffffffff);

  return consumed;
}